

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_avx2.c
# Opt level: O0

parasail_profile_t *
parasail_profile_create_avx_256_sat(char *s1,int s1Len,parasail_matrix_t *matrix)

{
  parasail_profile_t *ppVar1;
  parasail_profile_t *__ptr;
  parasail_profile_t *__ptr_00;
  parasail_matrix_t *in_stack_00000040;
  int in_stack_0000004c;
  char *in_stack_00000050;
  parasail_profile_t *profile32;
  parasail_profile_t *profile16;
  parasail_profile_t *profile8;
  parasail_matrix_t *matrix_local;
  int s1Len_local;
  char *s1_local;
  
  ppVar1 = parasail_profile_create_avx_256_8(in_stack_00000050,in_stack_0000004c,in_stack_00000040);
  __ptr = parasail_profile_create_avx_256_16(in_stack_00000050,in_stack_0000004c,in_stack_00000040);
  __ptr_00 = parasail_profile_create_avx_256_32
                       (in_stack_00000050,in_stack_0000004c,in_stack_00000040);
  (ppVar1->profile16).score = (__ptr->profile16).score;
  (ppVar1->profile16).matches = (__ptr->profile16).matches;
  (ppVar1->profile16).similar = (__ptr->profile16).similar;
  (ppVar1->profile32).score = (__ptr_00->profile32).score;
  (ppVar1->profile32).matches = (__ptr_00->profile32).matches;
  (ppVar1->profile32).similar = (__ptr_00->profile32).similar;
  free(__ptr);
  free(__ptr_00);
  return ppVar1;
}

Assistant:

parasail_profile_t* parasail_profile_create_avx_256_sat(
        const char * const restrict s1, const int s1Len,
        const parasail_matrix_t *matrix)
{
    parasail_profile_t *profile8 = parasail_profile_create_avx_256_8(s1, s1Len, matrix);
    parasail_profile_t *profile16 = parasail_profile_create_avx_256_16(s1, s1Len, matrix);
    parasail_profile_t *profile32 = parasail_profile_create_avx_256_32(s1, s1Len, matrix);
    profile8->profile16 = profile16->profile16;
    profile8->profile32 = profile32->profile32;
    free(profile16);
    free(profile32);

    return profile8;
}